

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::AddForeignKeyConstraint
          (DuckTableEntry *this,optional_ptr<duckdb::ClientContext,_true> context,
          AlterForeignKeyInfo *info)

{
  bool bVar1;
  Catalog *args;
  SchemaCatalogEntry *args_1;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> _Var2;
  undefined8 uVar3;
  __uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_> _Var4;
  pointer pCVar5;
  reference this_00;
  pointer pCVar6;
  ClientContext *context_00;
  Binder *info_00;
  type args_2;
  size_type in_RCX;
  ulong __n;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_create_info;
  shared_ptr<duckdb::Binder,_true> binder;
  ForeignKeyInfo fk_info;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_100;
  __uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  local_f8;
  undefined1 local_f0 [32];
  __uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_> local_d0;
  __node_base local_c8;
  size_type local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  pointer local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> local_60;
  vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> vStack_48;
  
  local_c8._M_nxt = (_Hash_node_base *)info;
  local_c0 = in_RCX;
  local_b8._8_8_ = info;
  make_uniq<duckdb::CreateTableInfo,duckdb::SchemaCatalogEntry&,std::__cxx11::string&>
            ((duckdb *)&local_100,
             *(SchemaCatalogEntry **)&((context.ptr)->config).query_verification_enabled,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(context.ptr)->interrupted);
  bVar1 = *(bool *)((long)&((context.ptr)->config).home_directory._M_string_length + 1);
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  (pCVar5->super_CreateInfo).temporary = bVar1;
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  Value::operator=(&(pCVar5->super_CreateInfo).comment,
                   (Value *)((long)&((context.ptr)->config).home_directory.field_2 + 8));
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(pCVar5->super_CreateInfo).tags,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&((context.ptr)->config).profiler_settings._M_h._M_before_begin);
  ColumnList::Copy((ColumnList *)local_a8,
                   (ColumnList *)&((context.ptr)->config).asof_loop_join_threshold);
  local_d0._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
  super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
       (tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
       (tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)this;
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  ColumnList::operator=(&pCVar5->columns,(ColumnList *)local_a8);
  ColumnList::~ColumnList((ColumnList *)local_a8);
  for (__n = 0; __n < (ulong)((long)((long)((context.ptr)->config).set_variables._M_h.
                                           _M_single_bucket -
                                    ((context.ptr)->config).set_variables._M_h._M_rehash_policy.
                                    _M_next_resize) >> 3); __n = __n + 1) {
    pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_100);
    this_00 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                           *)&((context.ptr)->config).set_variables._M_h._M_rehash_policy.
                              _M_next_resize,__n);
    pCVar6 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->(this_00);
    (*pCVar6->_vptr_Constraint[3])((ColumnList *)local_a8,pCVar6);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                *)&pCVar5->constraints,
               (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               local_a8);
    if ((long *)CONCAT71(local_a8._1_7_,local_a8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_a8._1_7_,local_a8[0]) + 8))();
    }
  }
  local_a0._M_p = (pointer)&local_90;
  local_98 = (pointer)0x0;
  local_90._M_local_buf[0] = '\0';
  local_80._M_allocated_capacity = (size_type)&local_70;
  local_80._8_8_ = 0;
  local_70._M_local_buf[0] = '\0';
  local_60.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_48.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_48.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_48.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8[0] = FK_TYPE_PRIMARY_KEY_TABLE;
  ::std::__cxx11::string::_M_assign((string *)(local_a8 + 8));
  ::std::__cxx11::string::_M_assign((string *)local_80._M_local_buf);
  ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::operator=
            (&local_60,
             (vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
             (local_c0 + 200));
  ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::operator=
            (&vStack_48,
             (vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
             (local_c0 + 0xe0));
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  make_uniq<duckdb::ForeignKeyConstraint,duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<std::__cxx11::string,true>&,duckdb::ForeignKeyInfo>
            ((duckdb *)&local_f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(local_c0 + 0x98),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(local_c0 + 0xb0),(ForeignKeyInfo *)local_a8);
  local_f0._0_8_ =
       local_f8._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl;
  local_f8._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
       (tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)
       (_Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
        )0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
              *)&pCVar5->constraints,
             (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
             local_f0);
  if ((_Tuple_impl<0UL,_duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>)
      local_f0._0_8_ != (Constraint *)0x0) {
    (**(code **)(*(long *)local_f0._0_8_ + 8))();
  }
  local_f0._0_8_ = (Constraint *)0x0;
  if (local_f8._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
      .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       )0x0) {
    (**(code **)(*(long *)local_f8._M_t.
                          super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                          .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl
                + 8))();
  }
  _Var2._M_head_impl = local_100._M_head_impl;
  local_f8._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
       (tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)
       (_Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
        )0x0;
  if ((AlterForeignKeyInfo *)local_c8._M_nxt == (AlterForeignKeyInfo *)0x0) {
    local_100._M_head_impl = (CreateTableInfo *)0x0;
    local_f0._16_8_ = _Var2._M_head_impl;
    Binder::BindCreateTableCheckpoint
              ((Binder *)local_f0,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               (local_f0 + 0x10),
               *(SchemaCatalogEntry **)&((context.ptr)->config).query_verification_enabled);
    uVar3 = local_f0._0_8_;
    local_f0._0_8_ = (tuple<duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
    ::reset(&local_f8,(pointer)uVar3);
    ::std::
    unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
    ~unique_ptr((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                 *)local_f0);
    if ((ClientContext *)local_f0._16_8_ != (ClientContext *)0x0) {
      (*(((CreateInfo *)local_f0._16_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_f0._16_8_ = (ClientContext *)0x0;
  }
  else {
    context_00 = optional_ptr<duckdb::ClientContext,_true>::operator*
                           ((optional_ptr<duckdb::ClientContext,_true> *)(local_b8 + 8));
    Binder::CreateBinder
              ((Binder *)local_f0,context_00,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER)
    ;
    info_00 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)local_f0);
    local_f0._24_8_ = local_100._M_head_impl;
    local_100._M_head_impl = (CreateTableInfo *)0x0;
    Binder::BindCreateTableInfo
              ((Binder *)local_b8,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               info_00,(SchemaCatalogEntry *)(local_f0 + 0x18));
    uVar3 = local_b8._0_8_;
    local_b8._0_8_ =
         (__uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          )0x0;
    ::std::
    __uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
    ::reset(&local_f8,(pointer)uVar3);
    ::std::
    unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
    ~unique_ptr((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                 *)local_b8);
    if ((CreateTableInfo *)local_f0._24_8_ != (CreateTableInfo *)0x0) {
      (*(((CreateInfo *)local_f0._24_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_f0._24_8_ = (__buckets_ptr)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
  }
  args = (Catalog *)((context.ptr)->config).max_expression_depth;
  args_1 = *(SchemaCatalogEntry **)&((context.ptr)->config).query_verification_enabled;
  args_2 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                        *)&local_f8);
  make_uniq<duckdb::DuckTableEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::BoundCreateTableInfo&,duckdb::shared_ptr<duckdb::DataTable,true>&>
            ((duckdb *)local_f0,args,args_1,args_2,
             (shared_ptr<duckdb::DataTable,_true> *)
             &((context.ptr)->config).user_variables._M_h._M_bucket_count);
  _Var4._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
  super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
       local_d0._M_t.
       super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
       super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
  *(undefined8 *)
   local_d0._M_t.
   super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
   super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl = local_f0._0_8_;
  ::std::
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
  ~unique_ptr((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               *)&local_f8);
  ForeignKeyInfo::~ForeignKeyInfo((ForeignKeyInfo *)local_a8);
  if (local_100._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_100._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (_Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
         _Var4._M_t.
         super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
         super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::AddForeignKeyConstraint(optional_ptr<ClientContext> context,
                                                                 AlterForeignKeyInfo &info) {
	D_ASSERT(info.type == AlterForeignKeyType::AFT_ADD);
	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->temporary = temporary;
	create_info->comment = comment;
	create_info->tags = tags;

	create_info->columns = columns.Copy();
	for (idx_t i = 0; i < constraints.size(); i++) {
		create_info->constraints.push_back(constraints[i]->Copy());
	}
	ForeignKeyInfo fk_info;
	fk_info.type = ForeignKeyType::FK_TYPE_PRIMARY_KEY_TABLE;
	fk_info.schema = info.schema;
	fk_info.table = info.fk_table;
	fk_info.pk_keys = info.pk_keys;
	fk_info.fk_keys = info.fk_keys;
	create_info->constraints.push_back(
	    make_uniq<ForeignKeyConstraint>(info.pk_columns, info.fk_columns, std::move(fk_info)));

	unique_ptr<BoundCreateTableInfo> bound_create_info;
	if (context) {
		auto binder = Binder::CreateBinder(*context);
		bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);
	} else {
		bound_create_info = Binder::BindCreateTableCheckpoint(std::move(create_info), schema);
	}
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
}